

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUIComboBox * __thiscall
irr::gui::CGUIEnvironment::addComboBox
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,s32 id)

{
  IGUIComboBox *pIVar1;
  IGUIComboBox *t;
  IGUIEnvironment *in_stack_00000058;
  CGUIComboBox *in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  IReferenceCounted *in_stack_ffffffffffffffa8;
  
  pIVar1 = (IGUIComboBox *)operator_new(0x1b0);
  CGUIComboBox::CGUIComboBox
            (in_stack_00000060,in_stack_00000058,(IGUIElement *)this,rectangle._4_4_,
             (rect<int>)in_stack_00000068);
  IReferenceCounted::drop(in_stack_ffffffffffffffa8);
  return pIVar1;
}

Assistant:

IGUIComboBox *CGUIEnvironment::addComboBox(const core::rect<s32> &rectangle,
		IGUIElement *parent, s32 id)
{
	IGUIComboBox *t = new CGUIComboBox(this, parent ? parent : this,
			id, rectangle);
	t->drop();
	return t;
}